

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_attribute<char> * __thiscall
rapidxml::xml_node<char>::first_attribute
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  xml_attribute<char> **ppxVar2;
  xml_attribute<char> *pxVar3;
  size_t size1;
  char *p1;
  
  if (name == (char *)0x0) {
    pxVar3 = this->m_first_attribute;
  }
  else {
    if (name_size == 0) {
      name_size = internal::measure<char>(name);
    }
    ppxVar2 = &this->m_first_attribute;
    while (pxVar3 = *ppxVar2, pxVar3 != (xml_attribute<char> *)0x0) {
      p1 = (pxVar3->super_xml_base<char>).m_name;
      if (p1 == (char *)0x0) {
        p1 = &xml_base<char>::nullstr()::zero;
        size1 = 0;
      }
      else {
        size1 = (pxVar3->super_xml_base<char>).m_name_size;
      }
      bVar1 = internal::compare<char>(p1,size1,name,name_size,case_sensitive);
      if (bVar1) {
        return pxVar3;
      }
      ppxVar2 = &pxVar3->m_next_attribute;
    }
    pxVar3 = (xml_attribute<char> *)0x0;
  }
  return pxVar3;
}

Assistant:

xml_attribute<Ch> *first_attribute(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_attribute<Ch> *attribute = m_first_attribute; attribute; attribute = attribute->m_next_attribute)
                    if (internal::compare(attribute->name(), attribute->name_size(), name, name_size, case_sensitive))
                        return attribute;
                return 0;
            }
            else
                return m_first_attribute;
        }